

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::computeQuadTexCoord
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,TextureGatherCubeCase *this
          ,int iterationNdx)

{
  const_reference pvVar1;
  Vector<float,_2> local_30;
  Vec2 maxC;
  Vec2 minC;
  bool corners;
  int iterationNdx_local;
  TextureGatherCubeCase *this_local;
  vector<float,_std::allocator<float>_> *res;
  
  if (((this->super_TextureGatherCase).m_flags & 2) == 0) {
    tcu::Vector<float,_2>::Vector(&maxC,-1.2);
    tcu::Vector<float,_2>::Vector(&local_30,1.2);
  }
  else {
    tcu::Vector<float,_2>::Vector(&maxC,-0.6,-1.2);
    tcu::Vector<float,_2>::Vector(&local_30,0.6,1.2);
  }
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  pvVar1 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
           ::operator[](&this->m_iterations,(long)iterationNdx);
  glu::TextureTestUtil::computeQuadTexCoordCube(__return_storage_ptr__,pvVar1->face,&maxC,&local_30)
  ;
  return __return_storage_ptr__;
}

Assistant:

vector<float> TextureGatherCubeCase::computeQuadTexCoord (int iterationNdx) const
{
	const bool		corners	= (m_flags & GATHERCASE_DONT_SAMPLE_CUBE_CORNERS) == 0;
	const Vec2		minC	= corners ? Vec2(-1.2f) : Vec2(-0.6f, -1.2f);
	const Vec2		maxC	= corners ? Vec2( 1.2f) : Vec2( 0.6f,  1.2f);
	vector<float>	res;
	glu::TextureTestUtil::computeQuadTexCoordCube(res, m_iterations[iterationNdx].face, minC, maxC);
	return res;
}